

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
          (ConstPixelBufferAccess *this,TextureFormat *format,int width,int height,int depth,
          void *data)

{
  void *data_local;
  int depth_local;
  int height_local;
  int width_local;
  TextureFormat *format_local;
  ConstPixelBufferAccess *this_local;
  
  this->m_format = *format;
  Vector<int,_3>::Vector(&this->m_size,width,height,depth);
  calculatePackedPitch((tcu *)&this->m_pitch,&this->m_format,&this->m_size);
  this->m_data = data;
  return;
}

Assistant:

ConstPixelBufferAccess::ConstPixelBufferAccess (const TextureFormat& format, int width, int height, int depth, const void* data)
	: m_format		(format)
	, m_size		(width, height, depth)
	, m_pitch		(calculatePackedPitch(m_format, m_size))
	, m_data		((void*)data)
{
	DE_ASSERT(isValid(format));
}